

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddTxSign(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                int hash_type,char *sign_data_hex,bool use_der_encode,int sighash_type,
                bool sighash_anyone_can_pay,bool clear_stack,char **tx_string)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RCX;
  SigHashType *in_RDX;
  uint32_t in_R8D;
  bool *in_stack_00000008;
  byte in_stack_00000010;
  uint8_t in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  undefined8 *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  OutPoint outpoint;
  bool is_bitcoin;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  ByteData signature_bytes;
  SigHashType sighashtype;
  SignParameter param;
  bool is_witness;
  AddressType addr_type;
  undefined6 in_stack_fffffffffffff928;
  undefined1 in_stack_fffffffffffff92e;
  undefined1 in_stack_fffffffffffff92f;
  ConfidentialTransactionContext *in_stack_fffffffffffff930;
  value_type *in_stack_fffffffffffff938;
  ConfidentialTransactionContext *in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  CfdError error_code;
  SignParameter *in_stack_fffffffffffff950;
  allocator *paVar4;
  SigHashType *in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  undefined1 der_encode;
  ByteData *in_stack_fffffffffffff968;
  SignParameter *in_stack_fffffffffffff970;
  bool *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff990;
  SignParameter *in_stack_fffffffffffff9c8;
  SignParameter *in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffffa17;
  string *in_stack_fffffffffffffa18;
  SignParameter *in_stack_fffffffffffffa20;
  allocator local_5b9;
  string local_5b8 [32];
  AbstractTransaction local_598 [11];
  string local_4e0;
  allocator local_4b9;
  string local_4b8 [32];
  AbstractTransaction local_498 [11];
  allocator local_3d9;
  string local_3d8;
  Txid local_3b8;
  OutPoint local_398;
  byte local_369;
  SigHashType local_350;
  undefined1 local_341 [157];
  SigHashType local_2a4 [11];
  allocator local_219;
  string local_218;
  ByteData local_1f8;
  SigHashType local_1dc [11];
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  CfdSourceLocation local_130;
  byte local_111;
  AddressType local_110;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  byte local_3b;
  byte local_3a;
  byte local_39;
  uint32_t local_34;
  char *local_30;
  SigHashType *local_28;
  int local_c;
  
  der_encode = (undefined1)((ulong)in_stack_fffffffffffff960 >> 0x38);
  error_code = (CfdError)((ulong)in_stack_fffffffffffff948 >> 0x20);
  local_39 = in_stack_00000010 & 1;
  local_3a = in_stack_00000020 & 1;
  local_3b = in_stack_00000028 & 1;
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_28 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_28);
  if (bVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x614;
    local_68.funcname = "CfdAddTxSign";
    cfd::core::logger::warn<>(&local_68,"tx is null or empty.");
    local_8a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. tx is null or empty.",&local_89);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff950,error_code,
               (string *)in_stack_fffffffffffff940);
    local_8a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (bVar1) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x61a;
    local_a8.funcname = "CfdAddTxSign";
    cfd::core::logger::warn<>(&local_a8,"txid is null or empty.");
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Failed to parameter. txid is null or empty.",&local_c9);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff950,error_code,
               (string *)in_stack_fffffffffffff940);
    local_ca = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000030 == (undefined8 *)0x0) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x620;
    local_e8.funcname = "CfdAddTxSign";
    cfd::core::logger::warn<>(&local_e8,"tx output is null.");
    local_10a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Failed to parameter. tx output is null.",paVar4);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff950,error_code,
               (string *)in_stack_fffffffffffff940);
    local_10a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_110 = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff990 >> 0x20));
  local_111 = 1;
  if ((local_110 == kP2shAddress) || (local_110 == kP2pkhAddress)) {
    local_111 = 0;
  }
  if ((in_stack_00000008 != (bool *)0x0) &&
     ((bVar1 = cfd::capi::IsEmptyString(in_stack_00000008), !bVar1 ||
      (((local_39 & 1) == 0 && ((local_111 & 1) != 0)))))) {
    cfd::SignParameter::SignParameter(in_stack_fffffffffffff950);
    if ((local_39 & 1) == 0) {
      in_stack_fffffffffffff990 = (string *)local_341;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_341 + 1),in_stack_00000008,(allocator *)in_stack_fffffffffffff990)
      ;
      cfd::core::SigHashType::SigHashType(&local_350,kSigHashAll,false,false);
      cfd::SignParameter::SignParameter
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17
                 ,in_RDX);
      cfd::SignParameter::operator=(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffff930);
      std::__cxx11::string::~string((string *)(local_341 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_341);
      in_stack_fffffffffffff988 = in_stack_00000008;
    }
    else {
      cfd::core::SigHashType::Create(local_1dc,in_stack_00000018,(bool)(local_3a & 1),false);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,in_stack_00000008,&local_219);
      cfd::core::ByteData::ByteData(&local_1f8,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      cfd::core::SigHashType::SigHashType(local_2a4,local_1dc);
      cfd::SignParameter::SignParameter
                (in_stack_fffffffffffff970,in_stack_fffffffffffff968,(bool)der_encode,
                 in_stack_fffffffffffff958);
      cfd::SignParameter::operator=(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffff930);
      cfd::core::ByteData::~ByteData((ByteData *)0x615634);
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x615813);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    local_369 = 0;
    cfd::capi::ConvertNetType
              ((int)((ulong)in_stack_fffffffffffff990 >> 0x20),in_stack_fffffffffffff988);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d8,local_30,&local_3d9);
    cfd::core::Txid::Txid(&local_3b8,&local_3d8);
    cfd::core::OutPoint::OutPoint(&local_398,&local_3b8,local_34);
    cfd::core::Txid::~Txid((Txid *)0x6158bf);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    if ((local_369 & 1) == 0) {
      paVar4 = &local_5b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,(char *)local_28,paVar4);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (in_stack_fffffffffffff930,
                 (string *)
                 CONCAT17(in_stack_fffffffffffff92f,
                          CONCAT16(in_stack_fffffffffffff92e,in_stack_fffffffffffff928)));
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      cfd::ConfidentialTransactionContext::AddSign
                (in_stack_fffffffffffff940,(OutPoint *)in_stack_fffffffffffff938,
                 (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffff930,(bool)in_stack_fffffffffffff92f,
                 (bool)in_stack_fffffffffffff92e);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&stack0xfffffffffffffa20,local_598);
      in_stack_fffffffffffff940 =
           (ConfidentialTransactionContext *)cfd::capi::CreateString(in_stack_fffffffffffff990);
      *in_stack_00000030 = in_stack_fffffffffffff940;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa20);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                (in_stack_fffffffffffff930);
    }
    else {
      paVar4 = &local_4b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b8,(char *)local_28,paVar4);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffff930,
                 (string *)
                 CONCAT17(in_stack_fffffffffffff92f,
                          CONCAT16(in_stack_fffffffffffff92e,in_stack_fffffffffffff928)));
      std::__cxx11::string::~string(local_4b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
      cfd::TransactionContext::AddSign
                ((TransactionContext *)in_stack_fffffffffffff940,
                 (OutPoint *)in_stack_fffffffffffff938,
                 (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffff930,(bool)in_stack_fffffffffffff92f,
                 (bool)in_stack_fffffffffffff92e);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_4e0,local_498);
      pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffff990);
      *in_stack_00000030 = pcVar3;
      std::__cxx11::string::~string((string *)&local_4e0);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffff930);
    }
    local_c = 0;
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x615c96);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_fffffffffffff940);
    cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffff930);
    return local_c;
  }
  local_130.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_130.filename = local_130.filename + 1;
  local_130.line = 0x62f;
  local_130.funcname = "CfdAddTxSign";
  cfd::core::logger::warn<>(&local_130,"sign data is null or empty.");
  local_152 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,"Failed to parameter. sign data is null or empty.",&local_151);
  cfd::core::CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffff950,error_code,
             (string *)in_stack_fffffffffffff940);
  local_152 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* sign_data_hex,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay,
    bool clear_stack, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    if ((sign_data_hex == nullptr) ||
        (IsEmptyString(sign_data_hex) && (use_der_encode || !is_witness))) {
      warn(CFD_LOG_SOURCE, "sign data is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sign data is null or empty.");
    }

    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(sign_data_hex));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(sign_data_hex));
    }
    std::vector<SignParameter> sign_list;
    sign_list.push_back(param);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddSign(outpoint, sign_list, is_witness, clear_stack);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddSign(outpoint, sign_list, is_witness, clear_stack);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}